

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::DoPreConfigureChecks(cmake *this)

{
  cmState *pcVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  int iVar5;
  char *pcVar6;
  allocator<char> local_1e9;
  string currentStart;
  string message;
  string srcList;
  ostringstream err;
  
  psVar3 = GetHomeDirectory_abi_cxx11_(this);
  std::__cxx11::string::string((string *)&srcList,(string *)psVar3);
  std::__cxx11::string::append((char *)&srcList);
  bVar2 = cmsys::SystemTools::FileExists(&srcList);
  if (bVar2) {
    pcVar1 = this->State;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"CMAKE_HOME_DIRECTORY",(allocator<char> *)&currentStart);
    psVar3 = cmState::GetInitializedCacheValue(pcVar1,(string *)&err);
    std::__cxx11::string::~string((string *)&err);
    if (psVar3 == (string *)0x0) {
      iVar5 = 0;
    }
    else {
      pcVar1 = this->State;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&currentStart,"CMAKE_HOME_DIRECTORY",(allocator<char> *)&message);
      psVar3 = cmState::GetInitializedCacheValue(pcVar1,&currentStart);
      std::__cxx11::string::string((string *)&err,(string *)psVar3);
      std::__cxx11::string::~string((string *)&currentStart);
      std::__cxx11::string::append((char *)&err);
      psVar3 = GetHomeDirectory_abi_cxx11_(this);
      std::__cxx11::string::string((string *)&currentStart,(string *)psVar3);
      std::__cxx11::string::append((char *)&currentStart);
      bVar2 = cmsys::SystemTools::SameFile((string *)&err,&currentStart);
      if (bVar2) {
        iVar5 = 1;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&message,"The source \"",&local_1e9);
        std::__cxx11::string::append((string *)&message);
        std::__cxx11::string::append((char *)&message);
        std::__cxx11::string::append((string *)&message);
        std::__cxx11::string::append((char *)&message);
        std::__cxx11::string::append((char *)&message);
        cmSystemTools::Error(&message);
        std::__cxx11::string::~string((string *)&message);
        iVar5 = -2;
      }
      std::__cxx11::string::~string((string *)&currentStart);
      std::__cxx11::string::~string((string *)&err);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
    psVar3 = GetHomeDirectory_abi_cxx11_(this);
    bVar2 = cmsys::SystemTools::FileIsDirectory(psVar3);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&err,"The source directory \"");
      psVar3 = GetHomeDirectory_abi_cxx11_(this);
      poVar4 = std::operator<<(poVar4,(string *)psVar3);
      pcVar6 = "\" does not appear to contain CMakeLists.txt.\n";
    }
    else {
      psVar3 = GetHomeDirectory_abi_cxx11_(this);
      bVar2 = cmsys::SystemTools::FileExists(psVar3);
      if (bVar2) {
        poVar4 = std::operator<<((ostream *)&err,"The source directory \"");
        psVar3 = GetHomeDirectory_abi_cxx11_(this);
        poVar4 = std::operator<<(poVar4,(string *)psVar3);
        pcVar6 = "\" is a file, not a directory.\n";
      }
      else {
        poVar4 = std::operator<<((ostream *)&err,"The source directory \"");
        psVar3 = GetHomeDirectory_abi_cxx11_(this);
        poVar4 = std::operator<<(poVar4,(string *)psVar3);
        pcVar6 = "\" does not exist.\n";
      }
    }
    std::operator<<(poVar4,pcVar6);
    std::operator<<((ostream *)&err,
                    "Specify --help for usage, or press the help button on the CMake GUI.");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&currentStart);
    std::__cxx11::string::~string((string *)&currentStart);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
    iVar5 = -2;
  }
  std::__cxx11::string::~string((string *)&srcList);
  return iVar5;
}

Assistant:

int cmake::DoPreConfigureChecks()
{
  // Make sure the Source directory contains a CMakeLists.txt file.
  std::string srcList = this->GetHomeDirectory();
  srcList += "/CMakeLists.txt";
  if (!cmSystemTools::FileExists(srcList)) {
    std::ostringstream err;
    if (cmSystemTools::FileIsDirectory(this->GetHomeDirectory())) {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not appear to contain CMakeLists.txt.\n";
    } else if (cmSystemTools::FileExists(this->GetHomeDirectory())) {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" is a file, not a directory.\n";
    } else {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not exist.\n";
    }
    err << "Specify --help for usage, or press the help button on the CMake "
           "GUI.";
    cmSystemTools::Error(err.str());
    return -2;
  }

  // do a sanity check on some values
  if (this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY")) {
    std::string cacheStart =
      *this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY");
    cacheStart += "/CMakeLists.txt";
    std::string currentStart = this->GetHomeDirectory();
    currentStart += "/CMakeLists.txt";
    if (!cmSystemTools::SameFile(cacheStart, currentStart)) {
      std::string message = "The source \"";
      message += currentStart;
      message += "\" does not match the source \"";
      message += cacheStart;
      message += "\" used to generate cache.  ";
      message += "Re-run cmake with a different source directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    return 0;
  }
  return 1;
}